

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager.cpp
# Opt level: O1

QNetworkReply * __thiscall
QRestAccessManagerPrivate::warnNoAccessManager(QRestAccessManagerPrivate *this)

{
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcQrest();
  if (((byte)QtPrivateLogging::lcQrest::category.field_2.bools.enabledWarning._q_value._M_base._M_i
      & 1) != 0) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_10 = QtPrivateLogging::lcQrest::category.name;
    QMessageLogger::warning(local_28,"QRestAccessManager: QNetworkAccessManager not set");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QNetworkReply *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply* QRestAccessManagerPrivate::warnNoAccessManager()
{
    qCWarning(lcQrest, "QRestAccessManager: QNetworkAccessManager not set");
    return nullptr;
}